

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int luaG_tracecall(lua_State *L)

{
  CallInfo *ci;
  long lVar1;
  
  ci = L->ci;
  lVar1 = *(long *)((((ci->func).p)->val).value_.f + 0x18);
  (ci->u).l.trap = 1;
  if ((ci->u).l.savedpc == *(Instruction **)(lVar1 + 0x40)) {
    if (*(char *)(lVar1 + 0xb) != '\0') {
      return 0;
    }
    if ((ci->callstatus & 0x40) == 0) {
      luaD_hookcall(L,ci);
      return 1;
    }
  }
  return 1;
}

Assistant:

int luaG_tracecall (lua_State *L) {
  CallInfo *ci = L->ci;
  Proto *p = ci_func(ci)->p;
  ci->u.l.trap = 1;  /* ensure hooks will be checked */
  if (ci->u.l.savedpc == p->code) {  /* first instruction (not resuming)? */
    if (p->is_vararg)
      return 0;  /* hooks will start at VARARGPREP instruction */
    else if (!(ci->callstatus & CIST_HOOKYIELD))  /* not yieded? */
      luaD_hookcall(L, ci);  /* check 'call' hook */
  }
  return 1;  /* keep 'trap' on */
}